

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O3

byte_vec_t *
sfc::pack_native_tile
          (byte_vec_t *__return_storage_ptr__,index_vec_t *data,Mode mode,uint bpp,uint width,
          uint height)

{
  byte *pbVar1;
  pointer puVar2;
  char cVar3;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined8 uVar9;
  index_vec_t *piVar10;
  char cVar11;
  value_type *__val;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  runtime_error *prVar15;
  int iVar16;
  pointer puVar17;
  uint x_1;
  byte bVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar22;
  byte bVar23;
  uint y_3;
  uint uVar24;
  byte bVar25;
  uint x_2;
  byte bVar26;
  uint x_3;
  ulong uVar27;
  byte bVar28;
  value_type *__val_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined2 uVar31;
  short sVar32;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  undefined1 auVar39 [12];
  byte_vec_t plane;
  string local_b0;
  string local_90;
  anon_class_1_0_00000001 local_69;
  ulong local_68;
  uint local_60;
  uint local_5c;
  pointer local_58;
  size_type sStack_50;
  ulong local_40;
  index_vec_t *local_38;
  char cVar4;
  char cVar5;
  undefined4 uVar33;
  undefined6 uVar34;
  undefined1 auVar36 [16];
  undefined2 uVar38;
  
  aVar22._4_4_ = in_register_0000008c;
  aVar22._0_4_ = height;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode < (gg|snes)) {
    if ((0x11aU >> (mode & (gg|sms)) & 1) != 0) {
      if ((width != 8) || (height != 8)) {
        auVar39 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
        local_58 = local_90._M_dataplus._M_p;
        sStack_50 = local_90._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x48;
        args_00.field_1.values_ = aVar22.values_;
        args_00.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b0,
                   (v10 *)
                   "programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")",
                   fmt_00,args_00);
        std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
        __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1 < bpp) {
        local_60 = bpp >> 1;
        local_68 = 0;
        uVar27 = 0;
        local_5c = bpp;
        local_38 = data;
        do {
          piVar10 = local_38;
          local_40 = uVar27;
          pauVar12 = (undefined1 (*) [16])operator_new(0x10);
          *pauVar12 = (undefined1  [16])0x0;
          puVar17 = (piVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (puVar17 !=
              (piVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar23 = 1;
            uVar24 = (uint)local_40;
            uVar27 = local_68;
            while (uVar24 != 0) {
              bVar23 = bVar23 * '\x02';
              uVar24 = (int)uVar27 - 1;
              uVar27 = (ulong)uVar24;
            }
            bVar25 = (char)local_40 * '\x02';
            lVar19 = 0;
            do {
              bVar26 = (*pauVar12)[lVar19 * 2];
              bVar28 = (*pauVar12)[lVar19 * 2 + 1];
              bVar18 = 7;
              lVar21 = 0;
              do {
                bVar26 = bVar26 | ((puVar17[lVar21] & bVar23) >> (bVar25 & 0x1f)) << (bVar18 & 0x1f)
                ;
                (*pauVar12)[lVar19 * 2] = bVar26;
                bVar28 = bVar28 | ((puVar17[lVar21] & bVar23 * '\x02') >> (bVar25 & 0x1f | 1)) <<
                                  (bVar18 & 0x1f);
                (*pauVar12)[lVar19 * 2 + 1] = bVar28;
                lVar21 = lVar21 + 1;
                bVar18 = bVar18 - 1;
              } while (lVar21 != 8);
              lVar19 = lVar19 + 1;
              puVar17 = puVar17 + 8;
            } while (lVar19 != 8);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,pauVar12,pauVar12 + 1);
          operator_delete(pauVar12,0x10);
          uVar24 = (int)local_40 + 1;
          uVar27 = (ulong)uVar24;
          local_68 = (ulong)((int)local_68 + 2);
          data = local_38;
          bpp = local_5c;
        } while (uVar24 != local_60);
      }
      if (bpp != 1) {
        return __return_storage_ptr__;
      }
      puVar17 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar27 = (long)puVar2 - (long)puVar17;
      if ((uVar27 & 7) != 0) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar15,"programmer error (in_data not multiple of 8 in make_1bit_planes)");
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar27 = uVar27 >> 3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,uVar27,
                 (allocator_type *)&local_90);
      if (puVar2 != puVar17) {
        uVar14 = 0;
        uVar24 = 0;
        do {
          pbVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start + uVar24;
          local_b0._M_dataplus._M_p[uVar14] =
               -((pbVar1[7] & 1) == 1) & 1U | -((pbVar1[3] & 1) == 1) & 0x10U |
               -((pbVar1[5] & 1) == 1) & 4U | -((pbVar1[1] & 1) == 1) & 0x40U |
               -((pbVar1[6] & 1) == 1) & 2U | -((pbVar1[2] & 1) == 1) & 0x20U |
               -((pbVar1[4] & 1) == 1) & 8U | -((*pbVar1 & 1) == 1) & 0x80U;
          uVar24 = uVar24 + 8;
          uVar14 = uVar14 + 1;
        } while ((uVar14 & 0xffffffff) < uVar27);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_b0._M_dataplus._M_p,
                 local_b0._M_string_length);
      goto joined_r0x00156029;
    }
    if ((0x18c00U >> (mode & (gg|sms)) & 1) == 0) goto LAB_00156049;
    if ((width != 8) || (height != 8)) {
      auVar39 = __cxa_allocate_exception(0x10);
      mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
      local_58 = local_90._M_dataplus._M_p;
      sStack_50 = local_90._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x48;
      args.field_1.values_ = aVar22.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,
                 (v10 *)"programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")"
                 ,fmt,args);
      std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
      __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp != 2) {
      if (bpp != 4) {
        auVar39 = __cxa_allocate_exception(0x10);
        mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
        local_58 = local_90._M_dataplus._M_p;
        sStack_50 = local_90._M_string_length;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x30;
        args_01.field_1.values_ = aVar22.values_;
        args_01.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_b0,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_01,
                   args_01);
        std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
        __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pauVar12 = (undefined1 (*) [16])operator_new(0x20);
      pauVar12[1] = (undefined1  [16])0x0;
      *pauVar12 = (undefined1  [16])0x0;
      auVar30 = _DAT_001657c0;
      auVar29 = _DAT_001657b0;
      puVar17 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar17 !=
          (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar19 = 0;
        do {
          pbVar1 = *pauVar12 + lVar19 * 4;
          bVar23 = *pbVar1;
          bVar25 = pbVar1[1];
          bVar26 = pbVar1[2];
          bVar28 = pbVar1[3];
          iVar20 = 7;
          lVar21 = 0;
          do {
            bVar18 = puVar17[lVar21];
            auVar35 = ZEXT416(CONCAT13(bVar18 >> 3,
                                       CONCAT12(bVar18 >> 2,CONCAT11(bVar18 >> 1,bVar18)))) &
                      auVar29;
            uVar38 = CONCAT11(auVar35[3],auVar35[3]);
            uVar33 = CONCAT31(CONCAT21(uVar38,auVar35[2]),auVar35[2]);
            uVar31 = CONCAT11(auVar35[0],auVar35[0]);
            auVar37._9_3_ = 0;
            auVar37._0_9_ = (unkuint9)0;
            auVar37._12_2_ = uVar38;
            auVar37._14_2_ = uVar38;
            uVar38 = (undefined2)uVar33;
            auVar36._12_4_ = auVar37._12_4_;
            auVar36[9] = 0;
            auVar36._0_9_ = (unkuint9)0;
            auVar36._10_2_ = uVar38;
            uVar9 = CONCAT62(auVar36._10_6_,uVar38);
            uVar38 = (undefined2)CONCAT51(CONCAT41(uVar33,auVar35[1]),auVar35[1]);
            auVar39._4_8_ = uVar9;
            auVar39._2_2_ = uVar38;
            auVar39._0_2_ = uVar38;
            auVar35._0_4_ = CONCAT22(uVar31,uVar31) << iVar20;
            auVar35._4_4_ = auVar39._0_4_;
            auVar35._8_4_ = (undefined4)uVar9;
            auVar35._12_4_ = auVar36._12_4_;
            auVar35 = auVar35 & auVar30;
            sVar6 = auVar35._0_2_;
            cVar11 = (0 < sVar6) * (sVar6 < 0x100) * auVar35[0] - (0xff < sVar6);
            sVar6 = auVar35._2_2_;
            sVar32 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar35[2] - (0xff < sVar6),cVar11);
            sVar6 = auVar35._4_2_;
            cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar35[4] - (0xff < sVar6);
            sVar6 = auVar35._6_2_;
            uVar33 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar35[6] - (0xff < sVar6),
                              CONCAT12(cVar3,sVar32));
            sVar6 = auVar35._8_2_;
            cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar35[8] - (0xff < sVar6);
            sVar6 = auVar35._10_2_;
            uVar34 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar35[10] - (0xff < sVar6),
                              CONCAT14(cVar4,uVar33));
            sVar6 = auVar35._12_2_;
            cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar35[0xc] - (0xff < sVar6);
            sVar8 = auVar35._14_2_;
            sVar6 = (short)((uint)uVar33 >> 0x10);
            sVar7 = (short)((uint6)uVar34 >> 0x20);
            sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar35[0xe] - (0xff < sVar8),
                                     CONCAT16(cVar5,uVar34)) >> 0x30);
            bVar23 = bVar23 | (0 < sVar32) * (sVar32 < 0x100) * cVar11 - (0xff < sVar32);
            bVar25 = bVar25 | (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
            bVar26 = bVar26 | (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
            bVar28 = bVar28 | (0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8);
            pbVar1 = *pauVar12 + lVar19 * 4;
            *pbVar1 = bVar23;
            pbVar1[1] = bVar25;
            pbVar1[2] = bVar26;
            pbVar1[3] = bVar28;
            lVar21 = lVar21 + 1;
            iVar20 = iVar20 + -1;
          } while (lVar21 != 8);
          lVar19 = lVar19 + 1;
          puVar17 = puVar17 + 8;
        } while (lVar19 != 8);
      }
      local_b0._M_dataplus._M_p =
           (pointer)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      local_b0.field_2._M_allocated_capacity =
           (size_type)
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)pauVar12;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(pauVar12 + 2);
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar12 + 2);
      goto joined_r0x00156029;
    }
    pauVar13 = (undefined1 (*) [16])operator_new(0x10);
    pauVar12 = pauVar13 + 1;
    *pauVar13 = (undefined1  [16])0x0;
    puVar17 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (puVar17 !=
        (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar19 = 0;
      do {
        bVar23 = (*pauVar13)[lVar19 * 2];
        bVar25 = (*pauVar13)[lVar19 * 2 + 1];
        bVar26 = 7;
        lVar21 = 0;
        do {
          bVar28 = puVar17[lVar21];
          bVar23 = bVar23 | (byte)((bVar28 & 1) << (bVar26 & 0x1f));
          (*pauVar13)[lVar19 * 2] = bVar23;
          bVar25 = bVar25 | (byte)((bVar28 >> 1 & 1) << (bVar26 & 0x1f));
          (*pauVar13)[lVar19 * 2 + 1] = bVar25;
          lVar21 = lVar21 + 1;
          bVar26 = bVar26 - 1;
        } while (lVar21 != 8);
        lVar19 = lVar19 + 1;
        puVar17 = puVar17 + 8;
      } while (lVar19 != 8);
    }
  }
  else {
LAB_00156049:
    if (1 < mode - ngp) {
      if (mode == snes_mode7) {
LAB_00156229:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (__return_storage_ptr__,data);
        return __return_storage_ptr__;
      }
      if ((2 < mode - gba) && (mode != wsc_packed)) {
        if (mode != pce_sprite) {
          return __return_storage_ptr__;
        }
        iVar20 = 0;
        do {
          puVar17 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          uVar27 = (long)puVar2 - (long)puVar17;
          if ((uVar27 & 7) != 0) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar15,"programmer error (in_data not multiple of 8 in make_1bit_planes)");
            __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar27 = uVar27 >> 3;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,uVar27,
                     (allocator_type *)&local_90);
          cVar11 = '\x01';
          for (iVar16 = iVar20; iVar16 != 0; iVar16 = iVar16 + -1) {
            cVar11 = cVar11 * '\x02';
          }
          if (puVar2 != puVar17) {
            auVar29 = pshuflw(ZEXT216(CONCAT11(cVar11,cVar11)),ZEXT216(CONCAT11(cVar11,cVar11)),0);
            uVar14 = 0;
            uVar24 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ =
                   *(ulong *)((data->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar24);
              auVar30 = auVar30 & auVar29;
              local_b0._M_dataplus._M_p[uVar14] =
                   ~-(auVar30[7] == '\0') & 0x80U | ~-(auVar30[3] == '\0') & 8U |
                   ~-(auVar30[5] == '\0') & 0x20U | ~-(auVar30[1] == '\0') & 2U |
                   ~-(auVar30[6] == '\0') & 0x40U | ~-(auVar30[2] == '\0') & 4U |
                   ~-(auVar30[4] == '\0') & 0x10U | ~-(auVar30[0] == '\0') & 1U;
              uVar24 = uVar24 + 8;
              uVar14 = uVar14 + 1;
            } while ((uVar14 & 0xffffffff) < uVar27);
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,local_b0._M_dataplus._M_p);
          if ((pointer)local_b0._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_b0._M_dataplus._M_p,
                            local_b0.field_2._M_allocated_capacity - (long)local_b0._M_dataplus._M_p
                           );
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != 4);
        return __return_storage_ptr__;
      }
      if (bpp != 4) {
        if (bpp != 8) {
          auVar39 = __cxa_allocate_exception(0x10);
          mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
          local_58 = local_90._M_dataplus._M_p;
          sStack_50 = local_90._M_string_length;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x30;
          args_04.field_1.args_ = aVar22.args_;
          args_04.desc_ = (unsigned_long_long)&local_58;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_b0,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_04,
                     args_04);
          std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
          __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                     );
        }
        goto LAB_00156229;
      }
      pack_native_tile::anon_class_1_0_00000001::operator()
                ((byte_vec_t *)&local_b0,&local_69,data,mode == wsc_packed);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (__return_storage_ptr__,&local_b0);
      goto joined_r0x00156029;
    }
    if ((width != 8) || (height != 8)) {
      auVar39 = __cxa_allocate_exception(0x10);
      mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
      local_58 = local_90._M_dataplus._M_p;
      sStack_50 = local_90._M_string_length;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x48;
      args_02.field_1.values_ = aVar22.values_;
      args_02.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,
                 (v10 *)"programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")"
                 ,fmt_02,args_02);
      std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
      __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bpp != 2) {
      auVar39 = __cxa_allocate_exception(0x10);
      mode_abi_cxx11_(&local_90,(sfc *)(ulong)mode,auVar39._8_4_);
      local_58 = local_90._M_dataplus._M_p;
      sStack_50 = local_90._M_string_length;
      fmt_03.size_ = 0xd;
      fmt_03.data_ = (char *)0x30;
      args_03.field_1.values_ = aVar22.values_;
      args_03.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"programmer error (unsupported bpp for mode \"{}\")",fmt_03,
                 args_03);
      std::runtime_error::runtime_error(auVar39._0_8_,(string *)&local_b0);
      __cxa_throw(auVar39._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pauVar13 = (undefined1 (*) [16])operator_new(0x10);
    pauVar12 = pauVar13 + 1;
    *pauVar13 = (undefined1  [16])0x0;
    puVar17 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (puVar17 !=
        (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar19 = 0;
      do {
        bVar23 = 0xe;
        uVar24 = 7;
        lVar21 = 0;
        do {
          (*pauVar13)[(ulong)(uVar24 >> 2) + lVar19 * 2] =
               (*pauVar13)[(ulong)(uVar24 >> 2) + lVar19 * 2] |
               (byte)((puVar17[lVar21] & 3) << (bVar23 & 6));
          lVar21 = lVar21 + 1;
          bVar23 = bVar23 - 2;
          uVar24 = uVar24 - 1;
        } while (lVar21 != 8);
        lVar19 = lVar19 + 1;
        puVar17 = puVar17 + 8;
      } while (lVar19 != 8);
    }
  }
  local_b0._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_b0.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)pauVar13;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)pauVar12;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pauVar12;
joined_r0x00156029:
  if ((pointer)local_b0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_b0._M_dataplus._M_p,
                    local_b0.field_2._M_allocated_capacity - (long)local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline byte_vec_t pack_native_tile(const index_vec_t& data, Mode mode, unsigned bpp, unsigned width, unsigned height) {

  // wsc/sms/gg planar style bit planes
  auto make_4bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(32);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;
    index_t mask2 = mask1 << 1;
    index_t mask3 = mask2 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;
    unsigned shift2 = plane_index + 2;
    unsigned shift3 = plane_index + 3;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 4 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 4 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
        p[y * 4 + 2] |= ((in_data[y * 8 + x] & mask2) >> shift2) << (7 - x);
        p[y * 4 + 3] |= ((in_data[y * 8 + x] & mask3) >> shift3) << (7 - x);
      }
    }
    return p;
  };

  // snes/gameboy style bit planes
  auto make_2bit_planes = [](const index_vec_t& in_data, unsigned plane_index) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    index_t mask0 = 1;
    for (unsigned i = 0; i < plane_index; ++i)
      mask0 <<= 1;
    index_t mask1 = mask0 << 1;

    unsigned shift0 = plane_index;
    unsigned shift1 = plane_index + 1;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        p[y * 2 + 0] |= ((in_data[y * 8 + x] & mask0) >> shift0) << (7 - x);
        p[y * 2 + 1] |= ((in_data[y * 8 + x] & mask1) >> shift1) << (7 - x);
      }
    }
    return p;
  };

  // regular bit planes
  auto make_1bit_planes = [](const index_vec_t& in_data, unsigned plane, bool reverse) {
    if (in_data.size() % 8)
      throw std::runtime_error("programmer error (in_data not multiple of 8 in make_1bit_planes)");

    size_t plane_size = in_data.size() >> 3;
    byte_vec_t p(plane_size);

    index_t mask = 1;
    for (unsigned i = 0; i < plane; ++i)
      mask <<= 1;

    for (unsigned index_b = 0, index_i = 0; index_b < plane_size; ++index_b) {
      index_t byte = 0;
      for (unsigned b = 0; b < 8; ++b) {
        if (in_data[index_i + b] & mask) {
          if (reverse)
            byte |= 1 << (7-b);
          else
            byte |= 1 << b;
        }
      }
      p[index_b] = byte;
      index_i += 8;
    }
    return p;
  };

  // gba/md style 2 pixels per byte data
  auto make_4bpp_bitpack = [](const index_vec_t& in_data, bool endian_swap) {
    if (in_data.size() % 2)
      throw std::runtime_error("programmer error (in_data not multiple of 2 in make_4bpp_bitpack)");

    byte_vec_t bv(in_data.size() >> 1);
    if (endian_swap) {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[(i << 1) + 1]) | (0xf0 & (in_data[i << 1] << 4));

    } else {
      for (unsigned i = 0; i < bv.size(); ++i)
        bv[i] = (0x0f & in_data[i << 1]) | (0xf0 & (in_data[(i << 1) + 1] << 4));

    }
    return bv;
  };

  // vb/ngp style 4 pixels per byte data
  auto make_2bpp_bitpack = [](const index_vec_t& in_data, bool reverse) {
    byte_vec_t p(16);
    if (in_data.empty())
      return p;

    for (unsigned y = 0; y < 8; ++y) {
      for (unsigned x = 0; x < 8; ++x) {
        unsigned px = reverse ? 7 - x : x;
        p[(y << 1) | (px >> 2)] |= (in_data[y * 8 + x] & 0x03) << ((px << 1) & 6);
      }
    }
    return p;
  };

  byte_vec_t nd;

  if (mode == Mode::snes || mode == Mode::gb || mode == Mode::gbc || mode == Mode::pce) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    unsigned planes = bpp >> 1;
    for (unsigned i = 0; i < planes; ++i) {
      auto plane = make_2bit_planes(data, i * 2);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
    // 1bpp had 0 iterations
    if(bpp == 1) {
      auto plane = make_1bit_planes(data, 0, true);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }

  } else if (mode == Mode::ws || mode == Mode::wsc || mode == Mode::gg || mode == Mode::sms) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 4) {
      nd = make_4bit_planes(data, 0);
    } else if (bpp == 2) {
      nd = make_2bit_planes(data, 0);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::ngp || mode == Mode::ngpc) {
    if (width != 8 || height != 8)
      throw std::runtime_error(
        fmt::format("programmer error (tile size not 8x8 in pack_native_tile() for mode \"{}\")", sfc::mode(mode)));

    if (bpp == 2) {
      nd = make_2bpp_bitpack(data, true);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::snes_mode7) {
    nd = data;

  } else if (mode == Mode::gba || mode == Mode::gba_affine || mode == Mode::md || mode == Mode::wsc_packed) {
    if (bpp == 8) {
      nd = data;
    } else if (bpp == 4) {
      nd = make_4bpp_bitpack(data, mode == Mode::wsc_packed);
    } else {
      throw std::runtime_error(
        fmt::format("programmer error (unsupported bpp for mode \"{}\")", sfc::mode(mode)));
    }

  } else if (mode == Mode::pce_sprite) {
    for (unsigned p = 0; p < 4; ++p) {
      auto plane = make_1bit_planes(data, p, false);
      nd.insert(nd.end(), plane.begin(), plane.end());
    }
  }

  return nd;
}